

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u16 uVar1;
  int iVar2;
  uint uVar3;
  undefined1 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  u8 *pSlot;
  int rc;
  int sz;
  int iEnd;
  u8 *pData;
  u8 *aData;
  int i;
  CellArray *in_stack_ffffffffffffff98;
  int *local_60;
  int *pRc;
  long lVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 *local_28;
  
  lVar4 = *(long *)(in_RDI + 0x50);
  pRc = (int *)*in_RDX;
  iVar2 = in_R8D + in_R9D;
  local_28 = in_RCX;
  do {
    if (iVar2 <= in_R8D) {
      *in_RDX = pRc;
      return 0;
    }
    uVar1 = cachedCellSize(in_stack_ffffffffffffff98,0);
    uVar3 = (uint)uVar1;
    if (((*(char *)(lVar4 + 1) == '\0') && (*(char *)(lVar4 + 2) == '\0')) ||
       (local_60 = (int *)pageFindSlot((MemPage *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),
                                       (int)((ulong)lVar4 >> 0x20),pRc), local_60 == (int *)0x0)) {
      if ((long)pRc - in_RSI < (long)(int)uVar3) {
        return 1;
      }
      local_60 = (int *)((long)pRc - (long)(int)uVar3);
      pRc = local_60;
    }
    memmove(local_60,*(void **)(*(long *)(pSlot + 0x10) + (long)in_R8D * 8),(long)(int)uVar3);
    *local_28 = (char)((ulong)((long)local_60 - lVar4) >> 8);
    local_28[1] = (char)local_60 - (char)lVar4;
    local_28 = local_28 + 2;
    in_R8D = in_R8D + 1;
  } while( true );
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content -area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i;
  u8 *aData = pPg->aData;
  u8 *pData = *ppData;
  int iEnd = iFirst + nCell;
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  for(i=iFirst; i<iEnd; i++){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
  }
  *ppData = pData;
  return 0;
}